

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  char cVar1;
  int iVar2;
  archive_read *paVar3;
  int64_t iVar4;
  int in_ESI;
  wchar_t ret_1;
  wchar_t ret;
  wchar_t tail;
  wchar_t i;
  char *p;
  int64_t current_offset;
  int64_t file_size;
  zip *zip;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  archive_read *in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  int iVar5;
  wchar_t local_4;
  
  if (in_ESI < 0x21) {
    paVar3 = (archive_read *)
             __archive_read_seek(in_stack_ffffffffffffffb0,
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    if ((long)paVar3 < 1) {
      local_4 = L'\0';
    }
    else {
      if (0x4000 < (long)paVar3) {
        paVar3 = (archive_read *)0x4000;
      }
      iVar2 = (int)paVar3;
      iVar4 = __archive_read_seek(paVar3,CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),0);
      if (iVar4 < 0) {
        local_4 = L'\0';
      }
      else {
        paVar3 = (archive_read *)
                 __archive_read_ahead
                           (paVar3,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (ssize_t *)0x1683b2);
        if (paVar3 == (archive_read *)0x0) {
          local_4 = L'\0';
        }
        else {
          iVar5 = 0;
          while (iVar5 <= iVar2 + -0x16) {
            cVar1 = *(char *)((long)&(paVar3->archive).magic + (long)iVar5 + 3);
            if (cVar1 == '\x05') {
              iVar5 = iVar5 + 1;
            }
            else if (cVar1 == '\x06') {
              if ((*(int *)((long)&(paVar3->archive).magic + (long)iVar5) == 0x6054b50) &&
                 (in_stack_ffffffffffffffbc =
                       read_eocd((zip *)paVar3,(char *)CONCAT44(iVar5,iVar2),
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
                 L'\0' < in_stack_ffffffffffffffbc)) {
                return in_stack_ffffffffffffffbc;
              }
              iVar5 = iVar5 + 1;
            }
            else if (cVar1 == '\a') {
              if ((*(int *)((long)&(paVar3->archive).magic + (long)iVar5) == 0x7064b50) &&
                 (in_stack_ffffffffffffffb8 =
                       read_zip64_eocd(paVar3,(zip *)CONCAT44(iVar5,iVar2),
                                       (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                        in_stack_ffffffffffffffb8)),
                 L'\0' < in_stack_ffffffffffffffb8)) {
                return in_stack_ffffffffffffffb8;
              }
              iVar5 = iVar5 + 4;
            }
            else if (cVar1 == 'K') {
              iVar5 = iVar5 + 2;
            }
            else if (cVar1 == 'P') {
              iVar5 = iVar5 + 3;
            }
            else {
              iVar5 = iVar5 + 4;
            }
          }
          local_4 = L'\0';
        }
      }
    }
  }
  else {
    local_4 = L'\xffffffff';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) or Zip64 locator
	 * record (which begins with PK\006\007) */
	tail = zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* TODO: Rework this to search backwards from the end.  We
	 * normally expect the EOCD record to be at the very end, so
	 * that should be significantly faster.  Tricky part: Make
	 * sure we still prefer the Zip64 locator if it's present. */
	for (i = 0; i <= tail - 22;) {
		switch (p[i + 3]) {
		case 'P': i += 3; break;
		case 'K': i += 2; break;
		case 005: i += 1; break;
		case 006:
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i, current_offset + i);
				if (ret > 0)
					return (ret);
			}
			i += 1; /* Look for PK\006\007 next */
			break;
		case 007:
			if (memcmp(p + i, "PK\006\007", 4) == 0) {
				int ret = read_zip64_eocd(a, zip, p + i);
				if (ret > 0)
					return (ret);
			}
			i += 4;
			break;
		default: i += 4; break;
		}
	}
	return 0;
}